

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.h
# Opt level: O0

string * __thiscall Type::surroundName(Type *this,string *name)

{
  string *in_RDX;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,in_RDX);
  return in_RDI;
}

Assistant:

virtual std::string surroundName(const std::string& name) {
        return name;
    }